

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aligned_array.h
# Opt level: O1

void __thiscall
webrtc::AlignedArray<float>::AlignedArray
          (AlignedArray<float> *this,size_t rows,size_t cols,size_t alignment)

{
  string *result;
  float **ppfVar1;
  float *pfVar2;
  ulong uVar3;
  size_t local_190;
  FatalMessage local_188;
  
  this->rows_ = rows;
  this->cols_ = cols;
  local_188.stream_ = (ostringstream)0x0;
  local_188._1_3_ = 0;
  local_190 = alignment;
  if (alignment == 0) {
    result = rtc::MakeCheckOpString<unsigned_long,unsigned_int>
                       (&local_190,(uint *)&local_188,"alignment > 0u");
  }
  else {
    result = (string *)0x0;
  }
  if (result == (string *)0x0) {
    ppfVar1 = (float **)AlignedMalloc(this->rows_ << 3,local_190);
    this->head_row_ = ppfVar1;
    if (this->rows_ != 0) {
      uVar3 = 0;
      do {
        pfVar2 = (float *)AlignedMalloc(this->cols_ << 2,local_190);
        this->head_row_[uVar3] = pfVar2;
        uVar3 = uVar3 + 1;
      } while (uVar3 < this->rows_);
    }
    return;
  }
  rtc::FatalMessage::FatalMessage
            (&local_188,
             "/workspace/llm4binary/github/license_c_cmakelists/ctwgL[P]webrtc-beamforming/webrtc/webrtc/system_wrappers/include/aligned_array.h"
             ,0x1a,result);
  rtc::FatalMessage::~FatalMessage(&local_188);
}

Assistant:

AlignedArray(size_t rows, size_t cols, size_t alignment)
      : rows_(rows),
        cols_(cols) {
    RTC_CHECK_GT(alignment, 0u);
    head_row_ = static_cast<T**>(AlignedMalloc(rows_ * sizeof(*head_row_),
                                               alignment));
    for (size_t i = 0; i < rows_; ++i) {
      head_row_[i] = static_cast<T*>(AlignedMalloc(cols_ * sizeof(**head_row_),
                                                   alignment));
    }
  }